

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int max_block_high(MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane)

{
  macroblockd_plane *pd;
  int max_blocks_high;
  int plane_local;
  BLOCK_SIZE bsize_local;
  MACROBLOCKD *xd_local;
  
  max_blocks_high = (int)block_size_high[bsize];
  if (xd->mb_to_bottom_edge < 0) {
    max_blocks_high =
         (xd->mb_to_bottom_edge >> ((char)xd->plane[plane].subsampling_y + 3U & 0x1f)) +
         max_blocks_high;
  }
  return max_blocks_high >> 2;
}

Assistant:

static inline int max_block_high(const MACROBLOCKD *xd, BLOCK_SIZE bsize,
                                 int plane) {
  int max_blocks_high = block_size_high[bsize];

  if (xd->mb_to_bottom_edge < 0) {
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    max_blocks_high += xd->mb_to_bottom_edge >> (3 + pd->subsampling_y);
  }

  // Scale the height in the transform block unit.
  return max_blocks_high >> MI_SIZE_LOG2;
}